

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttributeExtract.cpp
# Opt level: O2

void __thiscall cali::AttributeExtract::~AttributeExtract(AttributeExtract *this)

{
  std::__shared_ptr<cali::AttributeExtract::AttributeExtractImpl,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<cali::AttributeExtract::AttributeExtractImpl,_(__gnu_cxx::_Lock_policy)2>
              *)this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->mP).
              super___shared_ptr<cali::AttributeExtract::AttributeExtractImpl,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

AttributeExtract::~AttributeExtract()
{
    mP.reset();
}